

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SteppingZomby.cpp
# Opt level: O0

void anon_unknown.dwarf_77f7::doSomething(Listener *listener,string *callingFunctionName)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [16];
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  int local_74;
  duration<long,std::ratio<1l,1000l>> local_70 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [16];
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  string *local_18;
  string *callingFunctionName_local;
  Listener *listener_local;
  
  local_18 = callingFunctionName;
  callingFunctionName_local = (string *)listener;
  std::operator+(&local_58,callingFunctionName," started\n");
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::shared_ptr<std::__cxx11::string_const>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string_const> *)&local_28,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_38);
  (*listener->_vptr_Listener[2])(listener,(shared_ptr<std::__cxx11::string_const> *)&local_28);
  std::
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(&local_28);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_38);
  std::__cxx11::string::~string((string *)&local_58);
  local_74 = 1000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_70,&local_74);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)local_70);
  psVar1 = callingFunctionName_local;
  std::operator+(&local_b8,local_18," finished\n");
  std::make_shared<std::__cxx11::string,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::shared_ptr<std::__cxx11::string_const>::shared_ptr<std::__cxx11::string,void>
            ((shared_ptr<std::__cxx11::string_const> *)&local_88,
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_98);
  (**(code **)(*(long *)psVar1 + 0x10))(psVar1,(shared_ptr<std::__cxx11::string_const> *)&local_88);
  std::
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr(&local_88);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void doSomething(Common::Listener& listener, std::string&& callingFunctionName)
{
    listener.processData(std::make_shared<Common::Listener::Data>(callingFunctionName + " started\n"));
    std::this_thread::sleep_for(std::chrono::milliseconds(1000));
    listener.processData(std::make_shared<Common::Listener::Data>(callingFunctionName + " finished\n"));
}